

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_ShortFlagCombined_Test::TestBody(OptionParser_ShortFlagCombined_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  char *args [3];
  anon_class_8_1_a7c1402f local_f8;
  NullCallback local_f0;
  anon_class_8_1_a7c1402f local_d0;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  int count;
  OptionParser_ShortFlagCombined_Test *this_local;
  
  parser.on_error_._M_invoker._4_4_ = 0;
  wabt::OptionParser::OptionParser((OptionParser *)local_a8,"prog","desc");
  local_d0.count = (int *)((long)&parser.on_error_._M_invoker + 4);
  std::function<void()>::function<OptionParser_ShortFlagCombined_Test::TestBody()::__0,void>
            ((function<void()> *)&local_c8,&local_d0);
  wabt::OptionParser::AddOption((OptionParser *)local_a8,'a',"a","help",&local_c8);
  std::function<void_()>::~function(&local_c8);
  local_f8.count = (int *)((long)&parser.on_error_._M_invoker + 4);
  std::function<void()>::function<OptionParser_ShortFlagCombined_Test::TestBody()::__1,void>
            ((function<void()> *)&local_f0,&local_f8);
  wabt::OptionParser::AddOption((OptionParser *)local_a8,'b',"b","help",&local_f0);
  std::function<void_()>::~function(&local_f0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)anon_var_dwarf_6db14;
  wabt::OptionParser::Parse((OptionParser *)local_a8,3,(char **)&gtest_ar.message_);
  local_12c = 7;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_128,"7","count",&local_12c,
             (int *)((long)&parser.on_error_._M_invoker + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

TEST(OptionParser, ShortFlagCombined) {
  int count = 0;
  OptionParser parser("prog", "desc");
  parser.AddOption('a', "a", "help", [&]() { count += 1; });
  parser.AddOption('b', "b", "help", [&]() { count += 2; });
  const char* args[] = {"prog name", "-aa", "-abb"};
  parser.Parse(3, const_cast<char**>(args));
  EXPECT_EQ(7, count);
}